

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_text_utf8(nk_str *str,int pos,char *text,int len)

{
  int in_ECX;
  nk_rune *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  nk_rune unicode;
  int byte_len;
  int i;
  undefined4 local_28;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI == 0) || (in_RDX == (nk_rune *)0x0)) || (in_ECX == 0)) {
    in_ECX = 0;
  }
  else {
    for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
      nk_utf_decode((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_ECX);
    }
    nk_str_insert_at_rune
              ((nk_str *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RDX >> 0x20));
  }
  return in_ECX;
}

Assistant:

NK_API int
nk_str_insert_text_utf8(struct nk_str *str, int pos, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;

    NK_ASSERT(str);
    NK_ASSERT(text);
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_insert_at_rune(str, pos, text, byte_len);
    return len;
}